

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O3

imgviz * __thiscall
imgviz::textInRectangle
          (imgviz *this,Mat *src,string *text,string *loc,int font_face,double font_scale,
          int thickness)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int baseline;
  Size text_size;
  _InputArray local_260;
  undefined4 local_248;
  int local_244;
  int local_240;
  undefined4 local_23c;
  undefined4 local_238;
  int local_234;
  Mat extender;
  _OutputArray local_1d0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  long *local_198;
  _InputArray *p_Stack_190;
  Size local_188;
  undefined8 uStack_180;
  Mat local_128 [96];
  Mat local_c8 [152];
  
  iVar3 = font_face;
  iVar1 = std::__cxx11::string::compare((char *)loc);
  if (iVar1 != 0) {
    __assert_fail("loc == \"lt+\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                  ,200,
                  "cv::Mat imgviz::textInRectangle(const cv::Mat, const std::string, const std::string, const int, const double, const int)"
                 );
  }
  cv::Mat::clone();
  uVar2 = *(uint *)this;
  if ((uVar2 & 0xfff) == 0) {
    local_188.width = 0;
    local_188.height = 0;
    local_198 = (long *)CONCAT44(local_198._4_4_,0x1010000);
    _extender = 0x2010000;
    p_Stack_190 = (_InputArray *)this;
    cv::cvtColor((cv *)&local_198,(_InputArray *)&extender,(_OutputArray *)0x8,0,iVar3);
    uVar2 = *(uint *)this;
  }
  if ((uVar2 & 0xfff) == 0x10) {
    cv::getTextSize((string *)&text_size,(int)text,font_scale,font_face,
                    (int *)(ulong)(uint)thickness);
    iVar3 = baseline + thickness + text_size.height;
    cv::Mat::zeros((int)(_InputArray *)&local_198,iVar3,*(int *)(src + 0xc));
    cv::Mat::Mat(&extender);
    (**(code **)(*local_198 + 0x18))(local_198,(_InputArray *)&local_198,&extender,0xffffffff);
    cv::Mat::~Mat(local_c8);
    cv::Mat::~Mat(local_128);
    cv::Mat::~Mat((Mat *)&local_188);
    p_Stack_190 = &local_260;
    local_260.flags = 0;
    local_260._4_4_ = 0x406fe000;
    local_198._0_4_ = -0x3efdfffa;
    local_188.width = 1;
    local_188.height = 1;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)&extender,(_InputArray *)&local_198);
    local_188.width = 0;
    local_188.height = 0;
    local_198 = (long *)CONCAT44(local_198._4_4_,0x1010000);
    local_260.sz.width = 0;
    local_260.sz.height = 0;
    local_260.flags = 0x1010000;
    local_1d0.super__InputArray.sz.width = 0;
    local_1d0.super__InputArray.sz.height = 0;
    local_1d0.super__InputArray.flags = 0x2010000;
    local_260.obj = this;
    local_1d0.super__InputArray.obj = this;
    p_Stack_190 = (_InputArray *)&extender;
    cv::vconcat((_InputArray *)&local_198,&local_260,&local_1d0);
    local_260.sz.width = 0;
    local_260.sz.height = 0;
    local_260.flags = 0x3010000;
    local_238 = 0;
    local_240 = text_size.width;
    local_23c = 0;
    local_198 = (long *)0x406fe00000000000;
    p_Stack_190 = (_InputArray *)0x406fe00000000000;
    local_188.width = 0;
    local_188.height = 0x406fe000;
    uStack_180 = 0;
    local_260.obj = this;
    local_234 = iVar3;
    cv::rectangle();
    local_244 = text_size.height + thickness * 2;
    local_188.width = 0;
    local_188.height = 0;
    local_198 = (long *)CONCAT44(local_198._4_4_,0x3010000);
    local_248 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1a8 = 0;
    uStack_1a0 = 0;
    p_Stack_190 = (_InputArray *)this;
    cv::putText(SUB84(font_scale,0),(_InputArray *)&local_198,text,&local_248,font_face,&local_1b8,
                thickness,8,0);
    cv::Mat::~Mat(&extender);
    return this;
  }
  __assert_fail("dst.type() == CV_8UC3",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                ,0xce,
                "cv::Mat imgviz::textInRectangle(const cv::Mat, const std::string, const std::string, const int, const double, const int)"
               );
}

Assistant:

cv::Mat textInRectangle(const cv::Mat src, const std::string text,
                        const std::string loc = "lt+",
                        const int font_face = cv::FONT_HERSHEY_SIMPLEX,
                        const double font_scale = 1, const int thickness = 2) {
  assert(loc == "lt+"); // TODO(wkentaro): support other loc

  cv::Mat dst = src.clone();
  if (dst.type() == CV_8UC1) {
    cv::cvtColor(dst, dst, cv::COLOR_GRAY2BGR);
  }
  assert(dst.type() == CV_8UC3);

  int baseline;
  cv::Size text_size =
      cv::getTextSize(text, font_face, font_scale, thickness, &baseline);
  baseline += thickness;

  cv::Point text_org = cv::Point(0, text_size.height + thickness * 2);

  cv::Point aabb1 = text_org + cv::Point(0, baseline - thickness * 2);
  cv::Point aabb2 =
      text_org + cv::Point(text_size.width, -text_size.height - thickness * 2);

  cv::Mat extender = cv::Mat::zeros(aabb1.y - aabb2.y, src.cols, CV_8UC3);
  extender.setTo(255);
  cv::vconcat(extender, dst, dst);

  cv::rectangle(dst, aabb1, aabb2,
                /*color=*/cv::Scalar(255, 255, 255),
                /*thickness=*/cv::FILLED);
  cv::putText(dst, text, /*org=*/text_org,
              /*fontFace=*/font_face,
              /*fontScale=*/font_scale, /*color=*/cv::Scalar(0, 0, 0),
              /*thickness=*/thickness);

  return dst;
}